

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DLM.cpp
# Opt level: O0

void __thiscall
OpenMD::DLM::rotateStep(DLM *this,int axes1,int axes2,RealType angle,Vector3d *ji,RotMat3x3d *A)

{
  RectMatrix<double,_3U,_3U> *pRVar1;
  SquareMatrix3<double> *m2;
  Vector<double,_3U> *v;
  double *pdVar2;
  SquareMatrix3<double> *this_00;
  uint in_EDX;
  uint in_ESI;
  double in_XMM0_Qa;
  SquareMatrix3<double> *pSVar3;
  RotMat3x3d rot;
  Vector3d tempJ;
  RotMat3x3d tempA;
  RealType cosAngle;
  RealType sinAngle;
  SquareMatrix<double,_3> *in_stack_fffffffffffffe08;
  SquareMatrix3<double> *in_stack_fffffffffffffe10;
  Vector3<double> *this_01;
  RectMatrix<double,_3U,_3U> *m;
  SquareMatrix3<double> *in_stack_fffffffffffffe48;
  RectMatrix<double,_3U,_3U> local_110;
  double local_b8;
  Vector<double,_3U> local_b0 [5];
  RectMatrix<double,_3U,_3U> *local_38;
  Vector3<double> *local_30;
  double local_18;
  uint local_10;
  uint local_c;
  
  local_18 = in_XMM0_Qa;
  local_10 = in_EDX;
  local_c = in_ESI;
  SquareMatrix3<double>::SquareMatrix3
            (in_stack_fffffffffffffe10,(SquareMatrix3<double> *)in_stack_fffffffffffffe08);
  local_b8 = 0.0;
  Vector<double,_3U>::Vector(local_b0,&local_b8);
  Vector3<double>::Vector3
            ((Vector3<double> *)in_stack_fffffffffffffe10,
             (Vector<double,_3U> *)in_stack_fffffffffffffe08);
  SquareMatrix<double,_3>::identity();
  SquareMatrix3<double>::SquareMatrix3(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  SquareMatrix<double,_3>::~SquareMatrix((SquareMatrix<double,_3> *)0x306738);
  local_38 = (RectMatrix<double,_3U,_3U> *)cos(local_18);
  local_30 = (Vector3<double> *)sin(local_18);
  m = local_38;
  m2 = (SquareMatrix3<double> *)RectMatrix<double,_3U,_3U>::operator()(&local_110,local_c,local_c);
  pRVar1 = local_38;
  (m2->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][0] = (double)m;
  v = (Vector<double,_3U> *)RectMatrix<double,_3U,_3U>::operator()(&local_110,local_10,local_10);
  v->data_[0] = (double)pRVar1;
  this_01 = local_30;
  pdVar2 = RectMatrix<double,_3U,_3U>::operator()(&local_110,local_c,local_10);
  *pdVar2 = (double)this_01;
  pSVar3 = (SquareMatrix3<double> *)((ulong)local_30 ^ 0x8000000000000000);
  this_00 = (SquareMatrix3<double> *)
            RectMatrix<double,_3U,_3U>::operator()(&local_110,local_10,local_c);
  (this_00->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][0] =
       (double)pSVar3;
  OpenMD::operator*(m,v);
  Vector3<double>::operator=(this_01,(Vector<double,_3U> *)this_00);
  OpenMD::operator*(in_stack_fffffffffffffe48,m2);
  SquareMatrix3<double>::operator=(this_00,pSVar3);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3068d5);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3068e2);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3068ef);
  return;
}

Assistant:

void DLM::rotateStep(int axes1, int axes2, RealType angle, Vector3d& ji,
                       RotMat3x3d& A) {
    RealType sinAngle;
    RealType cosAngle;
    // RealType angleSqr;
    // RealType angleSqrOver4;
    // RealType top, bottom;

    RotMat3x3d tempA(A);  // initialize the tempA
    Vector3d tempJ(0.0);

    RotMat3x3d rot = RotMat3x3d::identity();  // initalize rot as a unit matrix

    // use a small angle aproximation for sin and cosine

    // angleSqr = angle * angle;
    // angleSqrOver4 = angleSqr / 4.0;
    // top = 1.0 - angleSqrOver4;
    // bottom = 1.0 + angleSqrOver4;

    // cosAngle = top / bottom;
    // sinAngle = angle / bottom;

    // or don't use the small angle approximation:
    cosAngle          = cos(angle);
    sinAngle          = sin(angle);
    rot(axes1, axes1) = cosAngle;
    rot(axes2, axes2) = cosAngle;

    rot(axes1, axes2) = sinAngle;
    rot(axes2, axes1) = -sinAngle;

    // rotate the momentum acoording to: ji[] = rot[][] * ji[]
    ji = rot * ji;

    // This code comes from converting an algorithm detailed in
    // J. Chem. Phys. 107 (15), pp. 5840-5851 by Dullweber,
    // Leimkuhler and McLachlan (DLM) for use in our code.
    // In Appendix A, the DLM paper has the change to the rotation
    // matrix as: Q = Q * rot.transpose(), but our rotation matrix
    // A is actually equivalent to Q.transpose(). This fact can be
    // seen on page 5849 of the DLM paper where a lab frame
    // dipole \mu_i(t) is expressed in terms of a body-fixed
    // reference orientation, \bar{\mu_i} and the rotation matrix, Q:
    //  \mu_i(t) = Q * \bar{\mu_i}
    // Our code computes lab frame vectors from body-fixed reference
    // vectors using:
    //   v_{lab} = A.transpose() * v_{body}
    //  (See StuntDouble.hpp for confirmation of this fact).
    //
    // So, using the identity:
    //  (A * B).transpose() = B.transpose() * A.transpose(),  we
    // get the equivalent of Q = Q * rot.transpose() for our code to be:

    A = rot * A;
  }